

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O2

string * __thiscall
t_swift_generator::function_args_helper_struct_type_abi_cxx11_
          (string *__return_storage_ptr__,t_swift_generator *this,t_service *tservice,
          t_function *tfunction)

{
  int iVar1;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  iVar1 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])(tservice);
  std::operator+(&local_38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(extraout_var,iVar1),"_");
  std::operator+(&bStack_58,&local_38,&tfunction->name_);
  std::operator+(__return_storage_ptr__,&bStack_58,"_args");
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string t_swift_generator::function_args_helper_struct_type(t_service *tservice, t_function* tfunction) {
  return tservice->get_name() + "_" + tfunction->get_name() + "_args";
}